

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateStringReference(char *string)

{
  cJSON *pcVar1;
  char *pcVar2;
  cJSON *item;
  char *string_local;
  
  pcVar1 = cJSON_New_Item(&global_hooks);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->type = 0x110;
    pcVar2 = (char *)cast_away_const(string);
    pcVar1->valuestring = pcVar2;
  }
  return pcVar1;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateStringReference(const char *string)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if (item != NULL)
    {
        item->type = cJSON_String | cJSON_IsReference;
        item->valuestring = (char*)cast_away_const(string);
    }

    return item;
}